

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestRenderbufferFramebuffer
          (GetAttachmentParametersTest *this,bool depth_stencil)

{
  GLenum GVar1;
  undefined4 uVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  size_t sVar8;
  ulong uVar9;
  GLchar **ppGVar10;
  long lVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  GLint parameter_legacy;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLint parameter_dsa;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  GLenum local_1e8;
  undefined4 local_1e4;
  GetAttachmentParametersTest *local_1e0;
  ulong local_1d8;
  long local_1d0;
  Enum<int,_2UL> local_1c8;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  local_1e4 = (undefined4)CONCAT71(in_register_00000031,depth_stencil);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1d0 = CONCAT44(extraout_var,iVar6);
  bVar5 = true;
  uVar12 = 0;
  local_1e0 = this;
  do {
    lVar11 = local_1d0;
    local_1f8 = 0;
    local_1ec = 0;
    if ((uVar12 != 2 | (byte)local_1e4) == 1) {
      GVar1 = TestRenderbufferFramebuffer::attachments[uVar12];
      (**(code **)(local_1d0 + 0x830))(0x8d40,GVar1,0x8cd0,&local_1f8);
      dVar7 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar7,"glGetFramebufferParameteriv has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x110b);
      (**(code **)(lVar11 + 0x910))(this->m_fbo,GVar1,0x8cd0,&local_1ec);
      iVar6 = (**(code **)(lVar11 + 0x800))();
      if (iVar6 == 0) {
        if (local_1f8 == local_1ec) {
          if (local_1f8 != 0) {
            uVar9 = uVar12 ^ 2;
            ppGVar10 = TestRenderbufferFramebuffer::optional_pnames_strings;
            lVar11 = 0;
            local_1e8 = GVar1;
            local_1d8 = uVar12;
            local_1b8 = uVar9;
            do {
              lVar4 = local_1d0;
              GVar1 = local_1e8;
              if (lVar11 != 0x1c || uVar9 != 0) {
                local_1f0 = 0;
                local_1f4 = 0;
                uVar2 = *(undefined4 *)((long)TestRenderbufferFramebuffer::optional_pnames + lVar11)
                ;
                (**(code **)(local_1d0 + 0x830))(0x8d40,local_1e8,uVar2,&local_1f0);
                dVar7 = (**(code **)(lVar4 + 0x800))();
                glu::checkError(dVar7,"glGetFramebufferParameteriv has failed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                                ,0x1150);
                (**(code **)(lVar4 + 0x910))(this->m_fbo,GVar1,uVar2,&local_1f4);
                iVar6 = (**(code **)(lVar4 + 0x800))();
                uVar12 = local_1d8;
                if (iVar6 == 0) {
                  uVar9 = local_1b8;
                  if (local_1f0 == local_1f4) goto LAB_00a9e5f3;
                  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "GetNamedFramebufferAttachmentParameteriv returned ",0x32);
                  std::ostream::operator<<((ostringstream *)local_1a8,local_1f4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,", but ",6);
                  std::ostream::operator<<((ostringstream *)local_1a8,local_1f0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," was expected for ",0x12);
                  std::ostream::_M_insert<void_const*>((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," parameter name  for ",0x15);
                  pcVar3 = TestRenderbufferFramebuffer::attachments_strings[uVar12];
                  sVar8 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar3,sVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," attachment of renderbuffer framebuffer object.",
                             0x2f);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                }
                else {
                  local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40
                            );
                  uVar12 = local_1d8;
                  local_1c8.m_getName = glu::getErrorName;
                  local_1c8.m_value = iVar6;
                  tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)local_1a8);
                  this = local_1e0;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," error when called with ",0x18);
                  pcVar3 = *ppGVar10;
                  if (pcVar3 == (char *)0x0) {
                    std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
                  }
                  else {
                    sVar8 = strlen(pcVar3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,pcVar3,sVar8);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," parameter name for ",0x14);
                  pcVar3 = TestRenderbufferFramebuffer::attachments_strings[uVar12];
                  sVar8 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar3,sVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             " attachment of renderbuffer framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                             ,0x5e);
                  std::ostream::operator<<((ostream *)local_1a8,local_1f8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                bVar5 = false;
                uVar9 = local_1b8;
              }
LAB_00a9e5f3:
              lVar11 = lVar11 + 4;
              ppGVar10 = ppGVar10 + 1;
            } while (lVar11 != 0x24);
          }
        }
        else {
          local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ",0x32)
          ;
          std::ostream::operator<<((ostringstream *)local_1a8,local_1ec);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
          std::ostream::operator<<((ostringstream *)local_1a8,local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of renderbuffer framebuffer object."
                     ,0x6a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar5 = false;
        }
      }
      else {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40);
        local_1c8.m_getName = glu::getErrorName;
        local_1c8.m_value = iVar6;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                   ,0x51);
        pcVar3 = TestRenderbufferFramebuffer::attachments_strings[uVar12];
        sVar8 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," attachment of renderbuffer framebuffer object.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        bVar5 = false;
        this = local_1e0;
      }
    }
    uVar12 = uVar12 + 1;
    if (uVar12 == 5) {
      return bVar5;
    }
  } while( true );
}

Assistant:

bool GetAttachmentParametersTest::TestRenderbufferFramebuffer(bool depth_stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_DEPTH_ATTACHMENT, GL_STENCIL_ATTACHMENT, GL_DEPTH_STENCIL_ATTACHMENT,
											   GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };

	static const glw::GLchar* attachments_strings[] = { "GL_DEPTH_ATTACHMENT", "GL_STENCIL_ATTACHMENT",
														"GL_DEPTH_STENCIL_ATTACHMENT", "GL_COLOR_ATTACHMENT0",
														"GL_COLOR_ATTACHMENT1" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		/* Omit DEPTH_STENCIL_ATTACHMENT attachment if the renderbuffer is not depth-stencil. */
		if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
		{
			if (!depth_stencil)
			{
				continue;
			}
		}

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of renderbuffer framebuffer object."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy << " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter "
												   "name of renderbuffer framebuffer object."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = {
				GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME,   GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,	GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,	GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,  GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
				GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING
			};

			static const glw::GLchar* optional_pnames_strings[] = {
				"GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME",   "GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",	"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",	"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",  "GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE",
				"GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"
			};

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				/* Omit FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE pname when DEPTH_STENCIL_ATTACHMENT attachment is used. */
				if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
				{
					if (optional_pnames[i] == GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE)
					{
						continue;
					}
				}

				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of renderbuffer framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE "
						   "was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of renderbuffer framebuffer object." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}